

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

void __thiscall Assimp::IFC::Curve::SampleDiscrete(Curve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  IfcFloat IVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  unsigned_long *puVar4;
  size_type sVar5;
  undefined1 auVar6 [16];
  value_type local_70;
  ulong local_58;
  size_t i;
  IfcFloat delta;
  IfcFloat p;
  unsigned_long local_38;
  unsigned_long local_30;
  size_t cnt;
  IfcFloat b_local;
  IfcFloat a_local;
  TempMesh *out_local;
  Curve *this_local;
  
  cnt = (size_t)b;
  b_local = a;
  a_local = (IfcFloat)out;
  out_local = (TempMesh *)this;
  bVar2 = InRange(this,a);
  if (!bVar2) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x24b,
                  "virtual void Assimp::IFC::Curve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  bVar2 = InRange(this,(IfcFloat)cnt);
  if (!bVar2) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x24c,
                  "virtual void Assimp::IFC::Curve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  local_38 = 0;
  iVar3 = (*this->_vptr_Curve[6])(b_local,cnt);
  p = (IfcFloat)CONCAT44(extraout_var,iVar3);
  puVar4 = std::max<unsigned_long>(&local_38,(unsigned_long *)&p);
  IVar1 = a_local;
  local_30 = *puVar4;
  sVar5 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)a_local);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)IVar1,
             sVar5 + 1 + local_30);
  delta = b_local;
  auVar6._8_4_ = (int)(local_30 >> 0x20);
  auVar6._0_8_ = local_30;
  auVar6._12_4_ = 0x45300000;
  i = (size_t)(((double)cnt - b_local) /
              ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0)));
  for (local_58 = 0; IVar1 = a_local, local_58 <= local_30; local_58 = local_58 + 1) {
    (*this->_vptr_Curve[3])(delta,&local_70);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)IVar1,&local_70);
    delta = (double)i + delta;
  }
  return;
}

Assistant:

void Curve::SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
    ai_assert( InRange( a ) );
    ai_assert( InRange( b ) );

    const size_t cnt = std::max(static_cast<size_t>(0),EstimateSampleCount(a,b));
    out.mVerts.reserve( out.mVerts.size() + cnt + 1);

    IfcFloat p = a, delta = (b-a)/cnt;
    for(size_t i = 0; i <= cnt; ++i, p += delta) {
        out.mVerts.push_back(Eval(p));
    }
}